

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outrec)

{
  TEdge *pTVar1;
  OutRec *pOVar2;
  byte bVar3;
  TEdge *pTVar4;
  
  pTVar1 = (TEdge *)0x0;
  while (pTVar4 = pTVar1, e = e->PrevInAEL, e != (TEdge *)0x0) {
    pTVar1 = pTVar4;
    if ((((-1 < e->OutIdx) && (e->WindDelta != 0)) && (pTVar1 = e, pTVar4 != (TEdge *)0x0)) &&
       (pTVar1 = (TEdge *)0x0, pTVar4->OutIdx != e->OutIdx)) {
      pTVar1 = pTVar4;
    }
  }
  if (pTVar4 == (TEdge *)0x0) {
    pOVar2 = (OutRec *)0x0;
    bVar3 = false;
  }
  else {
    pOVar2 = *(OutRec **)
              (*(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]) +
              (long)pTVar4->OutIdx * 8);
    bVar3 = pOVar2->IsHole ^ 1;
  }
  outrec->FirstLeft = pOVar2;
  outrec->IsHole = (bool)bVar3;
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outrec)
{
  TEdge *e2 = e->PrevInAEL;
  TEdge *eTmp = 0;
  while (e2)
  {
    if (e2->OutIdx >= 0 && e2->WindDelta != 0)
    {
      if (!eTmp) eTmp = e2;
      else if (eTmp->OutIdx == e2->OutIdx) eTmp = 0;        
    }
    e2 = e2->PrevInAEL;
  }
  if (!eTmp)
  {
    outrec->FirstLeft = 0;
    outrec->IsHole = false;
  }
  else
  {
    outrec->FirstLeft = m_PolyOuts[eTmp->OutIdx];
    outrec->IsHole = !outrec->FirstLeft->IsHole;
  }
}